

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

_Bool build_pit(chunk *c,loc_conflict centre,wchar_t rating)

{
  wchar_t wVar1;
  wchar_t wVar2;
  monster_group_info group_info;
  monster_group_info group_info_00;
  monster_group_info group_info_01;
  monster_group_info group_info_02;
  monster_group_info group_info_03;
  monster_group_info group_info_04;
  monster_group_info group_info_05;
  monster_group_info group_info_06;
  monster_group_info group_info_07;
  monster_group_info group_info_08;
  monster_group_info group_info_09;
  monster_group_info group_info_10;
  monster_group_info group_info_11;
  monster_group_info group_info_12;
  monster_group_info group_info_13;
  monster_group_info group_info_14;
  monster_group_info group_info_15;
  monster_group_info group_info_16;
  monster_group_info group_info_17;
  monster_group_info group_info_18;
  monster_group_info group_info_19;
  monster_group_info group_info_20;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  uint32_t uVar8;
  monster_race *pmVar9;
  loc lVar10;
  loc_conflict grid;
  int y;
  monster_race *pmVar11;
  int iVar12;
  long lVar13;
  int x;
  bool bVar14;
  int x_00;
  wchar_t y_00;
  wchar_t x_01;
  ulong uVar15;
  monster_group_info info;
  monster_race *what [16];
  loc local_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  ulong local_d8;
  monster_race *local_d0;
  monster_race *local_c8;
  monster_race *local_c0 [18];
  
  local_f0 = (loc)centre;
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,L'\v',L'\x11');
  wVar7 = centre.y;
  if ((c->height <= wVar7) || (c->width <= centre.x)) {
    _Var4 = find_space((loc_conflict *)&local_f0,L'\v',L'\x11');
    if (!_Var4) {
      return false;
    }
    centre = (loc_conflict)((ulong)local_f0 & 0xffffffff);
    wVar7 = local_f0.y;
  }
  iVar5 = centre.x;
  lVar13 = 0;
  generate_room(c,wVar7 + L'\xfffffffb',iVar5 + L'\xfffffff8',wVar7 + L'\x05',iVar5 + L'\b',L'\0');
  draw_rectangle(c,wVar7 + L'\xfffffffb',iVar5 + L'\xfffffff8',wVar7 + L'\x05',iVar5 + L'\b',
                 FEAT_GRANITE,L'\f',false);
  fill_rectangle(c,wVar7 + L'\xfffffffc',iVar5 + L'\xfffffff9',wVar7 + L'\x04',iVar5 + L'\a',
                 FEAT_FLOOR,L'\0');
  draw_rectangle(c,wVar7 + L'\xfffffffd',iVar5 + L'\xfffffffa',wVar7 + L'\x03',iVar5 + L'\x06',
                 FEAT_GRANITE,L'\v',false);
  generate_hole(c,wVar7 + L'\xfffffffd',iVar5 + L'\xfffffffa',wVar7 + L'\x03',iVar5 + L'\x06',
                FEAT_CLOSED);
  set_pit_type(c->depth,L'\x01');
  event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,dun->pit_type->name);
  wVar1 = dun->pit_type->obj_rarity;
  get_mon_num_prep(mon_pit_hook);
  bVar3 = false;
  do {
    bVar14 = bVar3;
    pmVar9 = get_mon_num(c->depth + L'\n',c->depth);
    local_c0[lVar13 + 1] = pmVar9;
    lVar13 = lVar13 + 1;
    bVar3 = (bool)(bVar14 | pmVar9 == (monster_race *)0x0);
  } while (lVar13 != 0x10);
  _Var4 = false;
  get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
  if (!bVar14 && pmVar9 != (monster_race *)0x0) {
    if ((player->opts).opt[0x18] == true) {
      msg("Monster pit (%s)",dun->pit_type->name);
    }
    iVar5 = 0;
    do {
      lVar13 = 1;
      pmVar9 = local_c0[1];
      do {
        pmVar11 = local_c0[lVar13 + 1];
        if (pmVar11->level < pmVar9->level) {
          local_c0[lVar13] = pmVar11;
          local_c0[lVar13 + 1] = pmVar9;
          pmVar11 = pmVar9;
        }
        lVar13 = lVar13 + 1;
        pmVar9 = pmVar11;
      } while (lVar13 != 0x10);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0xf);
    lVar13 = 0;
    do {
      *(undefined8 *)((long)local_c0 + lVar13 + 8) =
           *(undefined8 *)((long)local_c0 + lVar13 * 2 + 8);
      lVar13 = lVar13 + 8;
    } while (lVar13 != 0x40);
    add_to_monster_rating(c,dun->pit_type->ave / 0x14 + 3);
    wVar6 = monster_group_index_new((chunk_conflict *)c);
    lVar10 = local_f0;
    place_new_monster(c,local_f0,local_c0[8],false,false,(monster_group_info)ZEXT416((uint)wVar6),
                      '\f');
    wVar2 = lVar10.x;
    iVar5 = wVar2 + L'\x03';
    y_00 = wVar7 + L'\xfffffffe';
    y = wVar7 + L'\x02';
    iVar12 = wVar2 + L'\xfffffffc';
    do {
      iVar12 = iVar12 + 1;
      lVar10 = (loc)loc(iVar12,y_00);
      group_info.role = 1;
      group_info.index = wVar6;
      group_info.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_c0[1],false,false,group_info,'\f');
      lVar10 = (loc)loc(iVar12,y);
      group_info_00.role = 1;
      group_info_00.index = wVar6;
      group_info_00.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_c0[1],false,false,group_info_00,'\f');
    } while (iVar12 < iVar5);
    local_c0[0] = local_c0[1];
    local_dc = wVar2 + L'\xfffffffb';
    iVar12 = wVar2 + L'\xfffffffa';
    do {
      iVar12 = iVar12 + 1;
      lVar10 = (loc)loc(iVar12,y_00);
      group_info_01.role = 1;
      group_info_01.index = wVar6;
      group_info_01.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_c0[2],false,false,group_info_01,'\f');
      lVar10 = (loc)loc(iVar12,y);
      group_info_02.role = 1;
      group_info_02.index = wVar6;
      group_info_02.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_c0[2],false,false,group_info_02,'\f');
    } while (iVar12 < wVar2 + L'\xfffffffc');
    local_e0 = wVar2 + L'\x04';
    iVar12 = iVar5;
    do {
      iVar12 = iVar12 + 1;
      lVar10 = (loc)loc(iVar12,y_00);
      group_info_03.role = 1;
      group_info_03.index = wVar6;
      group_info_03.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_c0[2],false,false,group_info_03,'\f');
      lVar10 = (loc)loc(iVar12,y);
      group_info_04.role = 1;
      group_info_04.index = wVar6;
      group_info_04.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_c0[2],false,false,group_info_04,'\f');
    } while (iVar12 < wVar2 + L'\x05');
    local_e8 = wVar7 + L'\xffffffff';
    local_c8 = local_c0[3];
    local_d0 = local_c0[4];
    x_01 = wVar2 + L'\xfffffffe';
    local_e4 = wVar2 + L'\x02';
    local_d8 = (ulong)(uint)y_00;
    do {
      y_00 = y_00 + L'\x01';
      lVar10 = (loc)loc(local_dc,y_00);
      pmVar9 = local_c0[0];
      group_info_05.role = 1;
      group_info_05.index = wVar6;
      group_info_05.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_c0[0],false,false,group_info_05,'\f');
      lVar10 = (loc)loc(wVar2 + L'\x05',y_00);
      group_info_06.role = 1;
      group_info_06.index = wVar6;
      group_info_06.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,pmVar9,false,false,group_info_06,'\f');
      lVar10 = (loc)loc(wVar2 + L'\xfffffffc',y_00);
      group_info_07.role = 1;
      group_info_07.index = wVar6;
      group_info_07.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_c0[2],false,false,group_info_07,'\f');
      lVar10 = (loc)loc(local_e0,y_00);
      group_info_08.role = 1;
      group_info_08.index = wVar6;
      group_info_08.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_c0[2],false,false,group_info_08,'\f');
      lVar10 = (loc)loc(wVar2 + L'\xfffffffd',y_00);
      pmVar9 = local_c8;
      group_info_09.role = 1;
      group_info_09.index = wVar6;
      group_info_09.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_c8,false,false,group_info_09,'\f');
      lVar10 = (loc)loc(iVar5,y_00);
      group_info_10.role = 1;
      group_info_10.index = wVar6;
      group_info_10.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,pmVar9,false,false,group_info_10,'\f');
      lVar10 = (loc)loc(x_01,y_00);
      pmVar9 = local_d0;
      group_info_11.role = 1;
      group_info_11.index = wVar6;
      group_info_11.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_d0,false,false,group_info_11,'\f');
      lVar10 = (loc)loc(local_e4,y_00);
      group_info_12.role = 1;
      group_info_12.index = wVar6;
      group_info_12.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,pmVar9,false,false,group_info_12,'\f');
      iVar12 = local_e8;
    } while (y_00 <= wVar7);
    iVar5 = wVar7 + L'\x01';
    x_00 = wVar2 + L'\xffffffff';
    lVar10 = (loc)loc(x_00,local_e8);
    group_info_13.role = 1;
    group_info_13.index = wVar6;
    group_info_13.player_race = (player_race *)0x0;
    place_new_monster(c,lVar10,local_c0[5],false,false,group_info_13,'\f');
    x = wVar2 + L'\x01';
    lVar10 = (loc)loc(x,iVar12);
    group_info_14.role = 1;
    group_info_14.index = wVar6;
    group_info_14.player_race = (player_race *)0x0;
    place_new_monster(c,lVar10,local_c0[5],false,false,group_info_14,'\f');
    lVar10 = (loc)loc(x_00,iVar5);
    group_info_15.role = 1;
    group_info_15.index = wVar6;
    group_info_15.player_race = (player_race *)0x0;
    place_new_monster(c,lVar10,local_c0[5],false,false,group_info_15,'\f');
    lVar10 = (loc)loc(x,iVar5);
    group_info_16.role = 1;
    group_info_16.index = wVar6;
    group_info_16.player_race = (player_race *)0x0;
    place_new_monster(c,lVar10,local_c0[5],false,false,group_info_16,'\f');
    do {
      x_01 = x_01 + L'\x01';
      lVar10 = (loc)loc(x_01,iVar5);
      group_info_17.role = 1;
      group_info_17.index = wVar6;
      group_info_17.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_c0[6],false,false,group_info_17,'\f');
      lVar10 = (loc)loc(x_01,iVar12);
      group_info_18.role = 1;
      group_info_18.index = wVar6;
      group_info_18.player_race = (player_race *)0x0;
      place_new_monster(c,lVar10,local_c0[6],false,false,group_info_18,'\f');
    } while (x_01 <= wVar2);
    lVar10 = (loc)loc(x,wVar7);
    group_info_19.role = 1;
    group_info_19.index = wVar6;
    group_info_19.player_race = (player_race *)0x0;
    place_new_monster(c,lVar10,local_c0[7],false,false,group_info_19,'\f');
    lVar10 = (loc)loc(x_00,wVar7);
    group_info_20.role = 1;
    group_info_20.index = wVar6;
    group_info_20.player_race = (player_race *)0x0;
    place_new_monster(c,lVar10,local_c0[7],false,false,group_info_20,'\f');
    iVar5 = wVar2 + L'\xfffffff6';
    uVar15 = local_d8;
    do {
      iVar5 = iVar5 + 1;
      wVar7 = Rand_div(100);
      iVar12 = (int)uVar15;
      if (wVar7 < wVar1) {
        grid = loc(iVar5,iVar12);
        wVar7 = c->depth;
        uVar8 = Rand_div(3);
        place_object((chunk_conflict *)c,grid,wVar7 + L'\n',uVar8 == 0,false,'\x04',L'\0');
      }
    } while ((iVar5 < wVar2 + L'\t') ||
            (uVar15 = (ulong)(iVar12 + 1), iVar5 = wVar2 + L'\xfffffff6', iVar12 < y));
    _Var4 = true;
  }
  return _Var4;
}

Assistant:

bool build_pit(struct chunk *c, struct loc centre, int rating)
{
	struct monster_race *what[16];
	int i, j, y, x, y1, x1, y2, x2;
	bool empty = false;
	int light = false;
	int alloc_obj;
	int height = 9;
	int width = 15;
	int group_index = 0;
	struct monster_group_info info = { 0, 0, 0 };

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Large room */
	y1 = centre.y - height / 2;
	y2 = centre.y + height / 2;
	x1 = centre.x - width / 2;
	x2 = centre.x + width / 2;

	/* Generate new room, outer walls and inner floor */
	generate_room(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, light);
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	/* Advance to the center room */
	y1 = y1 + 2;
	y2 = y2 - 2;
	x1 = x1 + 2;
	x2 = x2 - 2;

	/* Generate inner walls; add one door as entrance */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_INNER, false);
	generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

	/* Decide on the pit type */
	set_pit_type(c->depth, 1);
	event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, dun->pit_type->name);

	/* Chance of objects on the floor */
	alloc_obj = dun->pit_type->obj_rarity;
	
	/* Prepare allocation table */
	get_mon_num_prep(mon_pit_hook);

	/* Pick some monster types */
	for (i = 0; i < 16; i++) {
		/* Get a (hard) monster type */
		what[i] = get_mon_num(c->depth + 10, c->depth);

		/* Notice failure */
		if (!what[i]) empty = true;
	}

	/* Prepare allocation table */
	get_mon_num_prep(NULL);

	/* Oops */
	if (empty)
		return false;

	ROOM_LOG("Monster pit (%s)", dun->pit_type->name);

	/* Sort the entries XXX XXX XXX */
	for (i = 0; i < 16 - 1; i++) {
		/* Sort the entries */
		for (j = 0; j < 16 - 1; j++) {
			int i1 = j;
			int i2 = j + 1;

			int p1 = what[i1]->level;
			int p2 = what[i2]->level;

			/* Bubble */
			if (p1 > p2) {
				struct monster_race *tmp = what[i1];
				what[i1] = what[i2];
				what[i2] = tmp;
			}
		}
	}

	/* Select every other entry */
	for (i = 0; i < 8; i++)
		what[i] = what[i * 2];

	/* Increase the level rating */
	add_to_monster_rating(c, 3 + dun->pit_type->ave / 20);

	/* Get a group ID */
	group_index = monster_group_index_new(c);

	/* Center monster */
	info.index = group_index;
	info.role = MON_GROUP_LEADER;
	place_new_monster(c, centre, what[7], false, false, info, ORIGIN_DROP_PIT);

	/* Remaining monsters are servants */
	info.role = MON_GROUP_SERVANT;

	/* Top and bottom rows (middle) */
	for (x = centre.x - 3; x <= centre.x + 3; x++) {
		place_new_monster(c, loc(x, centre.y - 2), what[0], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y + 2), what[0], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	/* Corners */
	for (x = centre.x - 5; x <= centre.x - 4; x++) {
		place_new_monster(c, loc(x, centre.y - 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y + 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	for (x = centre.x + 4; x <= centre.x + 5; x++) {
		place_new_monster(c, loc(x, centre.y - 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y + 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	/* Corners */

	/* Middle columns */
	for (y = centre.y - 1; y <= centre.y + 1; y++) {
		place_new_monster(c, loc(centre.x - 5, y), what[0], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 5, y), what[0], false, false, info,
						  ORIGIN_DROP_PIT);

		place_new_monster(c, loc(centre.x - 4, y), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 4, y), what[1], false, false, info,
						  ORIGIN_DROP_PIT);

		place_new_monster(c, loc(centre.x - 3, y), what[2], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 3, y), what[2], false, false, info,
						  ORIGIN_DROP_PIT);

		place_new_monster(c, loc(centre.x - 2, y), what[3], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 2, y), what[3], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	/* Corners around the middle monster */
	place_new_monster(c, loc(centre.x - 1, centre.y - 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x + 1, centre.y - 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x - 1, centre.y + 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x + 1, centre.y + 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);

	/* Above/Below the center monster */
	for (x = centre.x - 1; x <= centre.x + 1; x++) {
		place_new_monster(c, loc(x, centre.y + 1), what[5], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y - 1), what[5], false, false, info,
						  ORIGIN_DROP_PIT);
	}

	/* Next to the center monster */
	place_new_monster(c, loc(centre.x + 1, centre.y), what[6], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x - 1, centre.y), what[6], false, false,
					  info, ORIGIN_DROP_PIT);

	/* Place some objects */
	for (y = centre.y - 2; y <= centre.y + 2; y++) {
		for (x = centre.x - 9; x <= centre.x + 9; x++) {
			/* Occasionally place an item, making it good 1/3 of the time */
			if (randint0(100) < alloc_obj) 
				place_object(c, loc(x, y), c->depth + 10, one_in_(3), false,
							 ORIGIN_PIT, 0);
		}
	}

	return true;
}